

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

int lj_lib_checkopt(lua_State *L,int narg,int def,char *lst)

{
  uint uVar1;
  int iVar2;
  GCstr *local_48;
  int local_40;
  int i;
  MSize len;
  char *opt;
  GCstr *s;
  char *lst_local;
  int def_local;
  int narg_local;
  lua_State *L_local;
  
  if (def < 0) {
    local_48 = lj_lib_checkstr(L,narg);
  }
  else {
    local_48 = lj_lib_optstr(L,narg);
  }
  L_local._4_4_ = def;
  if (local_48 != (GCstr *)0x0) {
    uVar1 = local_48->len;
    local_40 = 0;
    s = (GCstr *)lst;
    while( true ) {
      if ((char)(s->nextgc).gcptr64 == '\0') {
        lj_err_argv(L,narg,LJ_ERR_INVOPTM,local_48 + 1);
      }
      if (((byte)(s->nextgc).gcptr64 == uVar1) &&
         (iVar2 = memcmp(local_48 + 1,(void *)((long)&(s->nextgc).gcptr64 + 1),(ulong)uVar1),
         iVar2 == 0)) break;
      s = (GCstr *)((long)&(s->nextgc).gcptr64 + (long)(int)((byte)(s->nextgc).gcptr64 + 1));
      local_40 = local_40 + 1;
    }
    L_local._4_4_ = local_40;
  }
  return L_local._4_4_;
}

Assistant:

int lj_lib_checkopt(lua_State *L, int narg, int def, const char *lst)
{
  GCstr *s = def >= 0 ? lj_lib_optstr(L, narg) : lj_lib_checkstr(L, narg);
  if (s) {
    const char *opt = strdata(s);
    MSize len = s->len;
    int i;
    for (i = 0; *(const uint8_t *)lst; i++) {
      if (*(const uint8_t *)lst == len && memcmp(opt, lst+1, len) == 0)
	return i;
      lst += 1+*(const uint8_t *)lst;
    }
    lj_err_argv(L, narg, LJ_ERR_INVOPTM, opt);
  }
  return def;
}